

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void __thiscall proto2_unittest::TestRepeatedString::Clear(TestRepeatedString *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            ((RepeatedPtrFieldBase *)&(this->field_0)._impl_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_string2_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_bytes11_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_bytes12_.super_RepeatedPtrFieldBase);
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestRepeatedString::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestRepeatedString)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_string1_.Clear();
  _impl_.repeated_string2_.Clear();
  _impl_.repeated_bytes11_.Clear();
  _impl_.repeated_bytes12_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}